

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  int *in_RCX;
  size_t buflen;
  int *buflen_00;
  Curl_addrinfo *pCVar11;
  char *__s;
  char *pcVar12;
  char *pcVar13;
  Curl_addrinfo *pCVar14;
  curl_slist **ppcVar15;
  int port;
  Curl_easy *local_2a0;
  Curl_addrinfo *local_298;
  char *local_290;
  curl_slist **local_288;
  char *local_280;
  char address [64];
  char hostname [256];
  char entry_id [262];
  
  port = 0;
  puVar1 = &(data->state).field_0x6d2;
  *puVar1 = *puVar1 & 0xf7;
  ppcVar15 = &(data->state).resolve;
  local_2a0 = data;
  local_288 = ppcVar15;
  do {
    buflen_00 = &port;
    pcVar3 = *ppcVar15;
    if (pcVar3 == (curl_slist *)0x0) {
      *local_288 = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar13 = pcVar3->data;
    if (pcVar13 != (char *)0x0) {
      cVar2 = *pcVar13;
      buflen = CONCAT71((int7)((ulong)in_RCX >> 8),cVar2);
      if (cVar2 != '-') {
        pcVar13 = pcVar13 + (cVar2 == '+');
        pcVar6 = strchr(pcVar13,0x3a);
        if ((pcVar6 != (char *)0x0) && (sVar5 = (long)pcVar6 - (long)pcVar13, (long)sVar5 < 0x100))
        {
          memcpy(hostname,pcVar13,sVar5);
          hostname[sVar5] = '\0';
          uVar7 = strtoul(pcVar6 + 1,&local_290,10);
          if (uVar7 < 0x10000) {
            if ((local_290 != pcVar6 + 1) && (*local_290 == ':')) {
              port = (int)uVar7;
              local_280 = local_290 + 1;
              pcVar6 = local_290;
              pCVar14 = (Curl_addrinfo *)0x0;
              pCVar8 = (Curl_addrinfo *)0x0;
              while (pCVar11 = pCVar8, local_298 = pCVar14, *pcVar6 != '\0') {
                __s = pcVar6 + 1;
                pcVar13 = strchr(__s,0x2c);
                if (pcVar13 == (char *)0x0) {
                  sVar5 = strlen(__s);
                  pcVar13 = __s + sVar5;
                }
                pcVar12 = pcVar13;
                data = local_2a0;
                pCVar14 = local_298;
                if (*__s == '[') {
                  if ((pcVar13 == __s) || (pcVar13[-1] != ']')) goto LAB_0044e325;
                  __s = pcVar6 + 2;
                  pcVar12 = pcVar13 + -1;
                }
                uVar7 = (long)pcVar12 - (long)__s;
                pcVar6 = pcVar13;
                pCVar8 = pCVar11;
                if (uVar7 != 0) {
                  if (0x3f < uVar7) goto LAB_0044e325;
                  memcpy(address,__s,uVar7);
                  address[uVar7] = '\0';
                  pCVar8 = Curl_str2addr(address,port);
                  data = local_2a0;
                  if (pCVar8 == (Curl_addrinfo *)0x0) {
                    local_290 = pcVar13;
                    Curl_infof(local_2a0,"Resolve address \'%s\' found illegal",address);
                    pCVar14 = local_298;
                    pcVar13 = local_290;
                    goto LAB_0044e325;
                  }
                  pCVar14 = pCVar8;
                  if (pCVar11 != (Curl_addrinfo *)0x0) {
                    pCVar11->ai_next = pCVar8;
                    pCVar14 = local_298;
                  }
                }
              }
              local_290 = pcVar6;
              if (local_298 != (Curl_addrinfo *)0x0) {
                create_hostcache_id(hostname,port,entry_id,buflen);
                sVar5 = strlen(entry_id);
                data = local_2a0;
                if (local_2a0->share != (Curl_share *)0x0) {
                  Curl_share_lock(local_2a0,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
                }
                pvVar9 = Curl_hash_pick((data->dns).hostcache,entry_id,sVar5 + 1);
                if (pvVar9 != (void *)0x0) {
                  Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded",hostname,
                             (ulong)(uint)port);
                  Curl_hash_delete((data->dns).hostcache,entry_id,sVar5 + 1);
                }
                pCVar10 = Curl_cache_addr(data,local_298,hostname,port);
                if (pCVar10 != (Curl_dns_entry *)0x0) {
                  if (cVar2 != '+') {
                    pCVar10->timestamp = 0;
                  }
                  pCVar10->inuse = pCVar10->inuse + -1;
                }
                if (data->share != (Curl_share *)0x0) {
                  Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
                }
                if (pCVar10 == (Curl_dns_entry *)0x0) {
                  Curl_freeaddrinfo(local_298);
                  return CURLE_OUT_OF_MEMORY;
                }
                in_RCX = (int *)(ulong)(uint)port;
                pcVar13 = "";
                if (cVar2 == '+') {
                  pcVar13 = " (non-permanent)";
                }
                Curl_infof(data,"Added %s:%d:%s to DNS cache%s",hostname,in_RCX,local_280,pcVar13);
                if ((hostname[0] == '*') && (hostname[1] == '\0')) {
                  in_RCX = (int *)(ulong)(uint)port;
                  Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks",hostname,
                             in_RCX);
                  puVar1 = &(data->state).field_0x6d2;
                  *puVar1 = *puVar1 | 8;
                }
                goto LAB_0044e30d;
              }
            }
            data = local_2a0;
            pCVar14 = (Curl_addrinfo *)0x0;
            pcVar13 = local_290;
            goto LAB_0044e325;
          }
        }
        pCVar14 = (Curl_addrinfo *)0x0;
        pcVar13 = local_290;
LAB_0044e325:
        local_290 = pcVar13;
        Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
        Curl_freeaddrinfo(pCVar14);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }
      iVar4 = __isoc99_sscanf(pcVar13 + 1,"%255[^:]:%d",hostname);
      if (iVar4 == 2) {
        create_hostcache_id(hostname,port,entry_id,(size_t)buflen_00);
        sVar5 = strlen(entry_id);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        Curl_hash_delete((data->dns).hostcache,entry_id,sVar5 + 1);
        in_RCX = buflen_00;
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          in_RCX = buflen_00;
        }
      }
      else {
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'",pcVar3->data);
        in_RCX = buflen_00;
      }
    }
LAB_0044e30d:
    ppcVar15 = &pcVar3->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = false;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      bool permanent = TRUE;
      char *host_begin;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_begin = hostp->data;
      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end ||
         ((host_end - host_begin) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, host_begin, host_end - host_begin);
      hostname[host_end - host_begin] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it's already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded",
              hostname, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        if(permanent)
          dns->timestamp = 0; /* mark as permanent */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache%s",
            hostname, port, addresses, permanent ? "" : " (non-permanent)");

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks",
              hostname, port);
        data->state.wildcard_resolve = true;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}